

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  Scene *pSVar14;
  float **ppfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  RTCFilterFunctionN p_Var20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  int iVar27;
  long lVar28;
  byte bVar29;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  float fVar38;
  uint uVar39;
  float fVar42;
  float fVar45;
  vint4 bi;
  uint uVar43;
  float fVar44;
  uint uVar46;
  float fVar47;
  float fVar48;
  uint uVar49;
  float fVar50;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar51;
  float fVar56;
  float fVar60;
  vint4 ai;
  uint uVar52;
  uint uVar53;
  float fVar54;
  uint uVar57;
  uint uVar58;
  float fVar59;
  uint uVar61;
  uint uVar62;
  float fVar63;
  float fVar64;
  uint uVar65;
  uint uVar66;
  float fVar67;
  undefined1 auVar55 [16];
  uint uVar68;
  uint uVar69;
  float fVar70;
  uint uVar71;
  float fVar72;
  vint4 ai_1;
  uint uVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 local_a58 [16];
  Geometry *local_a48;
  ulong local_a40;
  ulong local_a38;
  long local_a30;
  undefined1 (*local_a28) [16];
  ulong local_a20;
  ulong local_a18;
  NodeRef *local_a10;
  RTCFilterFunctionNArguments args;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined1 local_928 [16];
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  float local_898 [4];
  float local_888 [4];
  float local_878 [4];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined4 local_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  local_a10 = stack + 1;
  stack[0] = root;
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_a18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar36 = uVar33 ^ 0x10;
  uVar31 = local_a18 ^ 0x10;
  iVar12 = (tray->tnear).field_0.i[k];
  iVar13 = (tray->tfar).field_0.i[k];
  local_a28 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar37 = true;
  local_a20 = uVar33;
  do {
    uVar30 = local_a10[-1].ptr;
    local_a10 = local_a10 + -1;
    while ((uVar30 & 8) == 0) {
      pfVar4 = (float *)(uVar30 + 0x20 + uVar33);
      fVar38 = (*pfVar4 - fVar6) * fVar9;
      fVar42 = (pfVar4[1] - fVar6) * fVar9;
      fVar45 = (pfVar4[2] - fVar6) * fVar9;
      fVar48 = (pfVar4[3] - fVar6) * fVar9;
      pfVar4 = (float *)(uVar30 + 0x20 + local_a18);
      fVar51 = (*pfVar4 - fVar7) * fVar10;
      fVar56 = (pfVar4[1] - fVar7) * fVar10;
      fVar60 = (pfVar4[2] - fVar7) * fVar10;
      fVar64 = (pfVar4[3] - fVar7) * fVar10;
      uVar52 = (uint)((int)fVar51 < (int)fVar38) * (int)fVar38 |
               (uint)((int)fVar51 >= (int)fVar38) * (int)fVar51;
      uVar57 = (uint)((int)fVar56 < (int)fVar42) * (int)fVar42 |
               (uint)((int)fVar56 >= (int)fVar42) * (int)fVar56;
      uVar61 = (uint)((int)fVar60 < (int)fVar45) * (int)fVar45 |
               (uint)((int)fVar60 >= (int)fVar45) * (int)fVar60;
      uVar65 = (uint)((int)fVar64 < (int)fVar48) * (int)fVar48 |
               (uint)((int)fVar64 >= (int)fVar48) * (int)fVar64;
      pfVar4 = (float *)(uVar30 + 0x20 + uVar35);
      fVar38 = (*pfVar4 - fVar8) * fVar11;
      fVar42 = (pfVar4[1] - fVar8) * fVar11;
      fVar45 = (pfVar4[2] - fVar8) * fVar11;
      fVar48 = (pfVar4[3] - fVar8) * fVar11;
      uVar39 = (uint)((int)fVar38 < iVar12) * iVar12 | (uint)((int)fVar38 >= iVar12) * (int)fVar38;
      uVar43 = (uint)((int)fVar42 < iVar12) * iVar12 | (uint)((int)fVar42 >= iVar12) * (int)fVar42;
      uVar46 = (uint)((int)fVar45 < iVar12) * iVar12 | (uint)((int)fVar45 >= iVar12) * (int)fVar45;
      uVar49 = (uint)((int)fVar48 < iVar12) * iVar12 | (uint)((int)fVar48 >= iVar12) * (int)fVar48;
      pfVar4 = (float *)(uVar30 + 0x20 + uVar36);
      fVar38 = (*pfVar4 - fVar6) * fVar9;
      fVar42 = (pfVar4[1] - fVar6) * fVar9;
      fVar45 = (pfVar4[2] - fVar6) * fVar9;
      fVar48 = (pfVar4[3] - fVar6) * fVar9;
      pfVar4 = (float *)(uVar30 + 0x20 + uVar31);
      fVar51 = (*pfVar4 - fVar7) * fVar10;
      fVar56 = (pfVar4[1] - fVar7) * fVar10;
      fVar60 = (pfVar4[2] - fVar7) * fVar10;
      fVar64 = (pfVar4[3] - fVar7) * fVar10;
      uVar68 = (uint)((int)fVar38 < (int)fVar51) * (int)fVar38 |
               (uint)((int)fVar38 >= (int)fVar51) * (int)fVar51;
      uVar69 = (uint)((int)fVar42 < (int)fVar56) * (int)fVar42 |
               (uint)((int)fVar42 >= (int)fVar56) * (int)fVar56;
      uVar71 = (uint)((int)fVar45 < (int)fVar60) * (int)fVar45 |
               (uint)((int)fVar45 >= (int)fVar60) * (int)fVar60;
      uVar73 = (uint)((int)fVar48 < (int)fVar64) * (int)fVar48 |
               (uint)((int)fVar48 >= (int)fVar64) * (int)fVar64;
      pfVar4 = (float *)(uVar30 + 0x20 + (uVar35 ^ 0x10));
      fVar38 = (*pfVar4 - fVar8) * fVar11;
      fVar42 = (pfVar4[1] - fVar8) * fVar11;
      fVar45 = (pfVar4[2] - fVar8) * fVar11;
      fVar48 = (pfVar4[3] - fVar8) * fVar11;
      uVar53 = (uint)(iVar13 < (int)fVar38) * iVar13 | (uint)(iVar13 >= (int)fVar38) * (int)fVar38;
      uVar58 = (uint)(iVar13 < (int)fVar42) * iVar13 | (uint)(iVar13 >= (int)fVar42) * (int)fVar42;
      uVar62 = (uint)(iVar13 < (int)fVar45) * iVar13 | (uint)(iVar13 >= (int)fVar45) * (int)fVar45;
      uVar66 = (uint)(iVar13 < (int)fVar48) * iVar13 | (uint)(iVar13 >= (int)fVar48) * (int)fVar48;
      auVar40._0_4_ =
           -(uint)((int)(((int)uVar68 < (int)uVar53) * uVar68 |
                        ((int)uVar68 >= (int)uVar53) * uVar53) <
                  (int)(((int)uVar39 < (int)uVar52) * uVar52 | ((int)uVar39 >= (int)uVar52) * uVar39
                       ));
      auVar40._4_4_ =
           -(uint)((int)(((int)uVar69 < (int)uVar58) * uVar69 |
                        ((int)uVar69 >= (int)uVar58) * uVar58) <
                  (int)(((int)uVar43 < (int)uVar57) * uVar57 | ((int)uVar43 >= (int)uVar57) * uVar43
                       ));
      auVar40._8_4_ =
           -(uint)((int)(((int)uVar71 < (int)uVar62) * uVar71 |
                        ((int)uVar71 >= (int)uVar62) * uVar62) <
                  (int)(((int)uVar46 < (int)uVar61) * uVar61 | ((int)uVar46 >= (int)uVar61) * uVar46
                       ));
      auVar40._12_4_ =
           -(uint)((int)(((int)uVar73 < (int)uVar66) * uVar73 |
                        ((int)uVar73 >= (int)uVar66) * uVar66) <
                  (int)(((int)uVar49 < (int)uVar65) * uVar65 | ((int)uVar49 >= (int)uVar65) * uVar49
                       ));
      uVar39 = movmskps((int)root.ptr,auVar40);
      root.ptr = (size_t)uVar39;
      if (uVar39 == 0xf) {
        bVar37 = local_a10 != stack;
        goto joined_r0x00252db1;
      }
      bVar29 = (byte)uVar39 ^ 0xf;
      uVar34 = uVar30 & 0xfffffffffffffff0;
      lVar28 = 0;
      if (bVar29 != 0) {
        for (; (bVar29 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
        }
      }
      uVar30 = *(ulong *)(uVar34 + lVar28 * 8);
      uVar39 = bVar29 - 1 & (uint)bVar29;
      root.ptr = (size_t)uVar39;
      if (uVar39 != 0) {
        local_a10->ptr = uVar30;
        local_a10 = local_a10 + 1;
        lVar28 = 0;
        if (root.ptr != 0) {
          for (; (uVar39 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
          }
        }
        uVar30 = *(ulong *)(uVar34 + lVar28 * 8);
        uVar39 = uVar39 - 1 & uVar39;
        uVar32 = (ulong)uVar39;
        if (uVar39 != 0) {
          do {
            local_a10->ptr = uVar30;
            local_a10 = local_a10 + 1;
            root.ptr = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> root.ptr & 1) == 0; root.ptr = root.ptr + 1) {
              }
            }
            uVar30 = *(ulong *)(uVar34 + root.ptr * 8);
            uVar32 = uVar32 & uVar32 - 1;
          } while (uVar32 != 0);
        }
      }
    }
    uVar33 = (ulong)((uint)uVar30 & 0xf);
    if (uVar33 != 8) {
      uVar30 = uVar30 & 0xfffffffffffffff0;
      local_a30 = 0;
      do {
        lVar28 = local_a30 * 0x50;
        pSVar14 = context->scene;
        ppfVar15 = (pSVar14->vertices).items;
        pfVar16 = ppfVar15[*(uint *)(uVar30 + 0x30 + lVar28)];
        pfVar4 = pfVar16 + *(uint *)(uVar30 + lVar28);
        fVar51 = *pfVar4;
        fVar56 = pfVar4[1];
        fVar60 = pfVar4[2];
        pfVar4 = pfVar16 + *(uint *)(uVar30 + 0x10 + lVar28);
        pfVar16 = pfVar16 + *(uint *)(uVar30 + 0x20 + lVar28);
        pfVar17 = ppfVar15[*(uint *)(uVar30 + 0x34 + lVar28)];
        pfVar1 = pfVar17 + *(uint *)(uVar30 + 4 + lVar28);
        fVar64 = *pfVar1;
        fVar70 = pfVar1[1];
        fVar44 = pfVar1[2];
        pfVar1 = pfVar17 + *(uint *)(uVar30 + 0x14 + lVar28);
        pfVar17 = pfVar17 + *(uint *)(uVar30 + 0x24 + lVar28);
        pfVar18 = ppfVar15[*(uint *)(uVar30 + 0x38 + lVar28)];
        pfVar2 = pfVar18 + *(uint *)(uVar30 + 8 + lVar28);
        fVar107 = *pfVar2;
        fVar72 = pfVar2[1];
        fVar47 = pfVar2[2];
        pfVar2 = pfVar18 + *(uint *)(uVar30 + 0x18 + lVar28);
        pfVar18 = pfVar18 + *(uint *)(uVar30 + 0x28 + lVar28);
        pfVar19 = ppfVar15[*(uint *)(uVar30 + 0x3c + lVar28)];
        pfVar3 = pfVar19 + *(uint *)(uVar30 + 0xc + lVar28);
        fVar109 = *pfVar3;
        fVar74 = pfVar3[1];
        fVar50 = pfVar3[2];
        pfVar3 = pfVar19 + *(uint *)(uVar30 + 0x1c + lVar28);
        root.ptr = (size_t)*(uint *)(uVar30 + 0x2c + lVar28);
        pfVar19 = pfVar19 + root.ptr;
        puVar5 = (undefined8 *)(uVar30 + 0x30 + lVar28);
        local_938 = *puVar5;
        uStack_930 = puVar5[1];
        puVar5 = (undefined8 *)(uVar30 + 0x40 + lVar28);
        local_948 = *puVar5;
        uStack_940 = puVar5[1];
        fVar83 = fVar51 - *pfVar4;
        fVar84 = fVar64 - *pfVar1;
        fVar85 = fVar107 - *pfVar2;
        fVar86 = fVar109 - *pfVar3;
        fVar89 = fVar56 - pfVar4[1];
        fVar91 = fVar70 - pfVar1[1];
        fVar93 = fVar72 - pfVar2[1];
        fVar95 = fVar74 - pfVar3[1];
        fVar97 = fVar60 - pfVar4[2];
        fVar98 = fVar44 - pfVar1[2];
        fVar99 = fVar47 - pfVar2[2];
        fVar100 = fVar50 - pfVar3[2];
        fVar54 = *pfVar16 - fVar51;
        fVar59 = *pfVar17 - fVar64;
        fVar63 = *pfVar18 - fVar107;
        fVar67 = *pfVar19 - fVar109;
        fVar79 = pfVar16[1] - fVar56;
        fVar80 = pfVar17[1] - fVar70;
        fVar81 = pfVar18[1] - fVar72;
        fVar82 = pfVar19[1] - fVar74;
        fVar75 = pfVar16[2] - fVar60;
        fVar76 = pfVar17[2] - fVar44;
        fVar77 = pfVar18[2] - fVar47;
        fVar78 = pfVar19[2] - fVar50;
        local_898[0] = fVar97 * fVar79 - fVar89 * fVar75;
        local_898[1] = fVar98 * fVar80 - fVar91 * fVar76;
        local_898[2] = fVar99 * fVar81 - fVar93 * fVar77;
        local_898[3] = fVar100 * fVar82 - fVar95 * fVar78;
        fVar38 = *(float *)(ray + k * 4);
        fVar42 = *(float *)(ray + k * 4 + 0x10);
        fVar45 = *(float *)(ray + k * 4 + 0x40);
        fVar48 = *(float *)(ray + k * 4 + 0x50);
        fVar51 = fVar51 - fVar38;
        fVar64 = fVar64 - fVar38;
        fVar107 = fVar107 - fVar38;
        fVar109 = fVar109 - fVar38;
        fVar56 = fVar56 - fVar42;
        fVar70 = fVar70 - fVar42;
        fVar72 = fVar72 - fVar42;
        fVar74 = fVar74 - fVar42;
        fVar101 = fVar51 * fVar48 - fVar56 * fVar45;
        fVar102 = fVar64 * fVar48 - fVar70 * fVar45;
        fVar103 = fVar107 * fVar48 - fVar72 * fVar45;
        fVar104 = fVar109 * fVar48 - fVar74 * fVar45;
        local_888[0] = fVar83 * fVar75 - fVar97 * fVar54;
        local_888[1] = fVar84 * fVar76 - fVar98 * fVar59;
        local_888[2] = fVar85 * fVar77 - fVar99 * fVar63;
        local_888[3] = fVar86 * fVar78 - fVar100 * fVar67;
        fVar38 = *(float *)(ray + k * 4 + 0x20);
        fVar42 = *(float *)(ray + k * 4 + 0x60);
        fVar60 = fVar60 - fVar38;
        fVar44 = fVar44 - fVar38;
        fVar47 = fVar47 - fVar38;
        fVar50 = fVar50 - fVar38;
        fVar105 = fVar60 * fVar45 - fVar51 * fVar42;
        fVar106 = fVar44 * fVar45 - fVar64 * fVar42;
        fVar108 = fVar47 * fVar45 - fVar107 * fVar42;
        fVar110 = fVar50 * fVar45 - fVar109 * fVar42;
        local_878[0] = fVar89 * fVar54 - fVar83 * fVar79;
        local_878[1] = fVar91 * fVar59 - fVar84 * fVar80;
        local_878[2] = fVar93 * fVar63 - fVar85 * fVar81;
        local_878[3] = fVar95 * fVar67 - fVar86 * fVar82;
        fVar90 = fVar56 * fVar42 - fVar60 * fVar48;
        fVar92 = fVar70 * fVar42 - fVar44 * fVar48;
        fVar94 = fVar72 * fVar42 - fVar47 * fVar48;
        fVar96 = fVar74 * fVar42 - fVar50 * fVar48;
        fVar38 = fVar45 * local_898[0] + fVar48 * local_888[0] + fVar42 * local_878[0];
        fVar87 = fVar45 * local_898[1] + fVar48 * local_888[1] + fVar42 * local_878[1];
        fVar88 = fVar45 * local_898[2] + fVar48 * local_888[2] + fVar42 * local_878[2];
        fVar42 = fVar45 * local_898[3] + fVar48 * local_888[3] + fVar42 * local_878[3];
        uVar39 = (uint)fVar38 & 0x80000000;
        uVar43 = (uint)fVar87 & 0x80000000;
        uVar46 = (uint)fVar88 & 0x80000000;
        uVar49 = (uint)fVar42 & 0x80000000;
        local_928._0_4_ =
             (float)((uint)(fVar54 * fVar90 + fVar79 * fVar105 + fVar75 * fVar101) ^ uVar39);
        local_928._4_4_ =
             (float)((uint)(fVar59 * fVar92 + fVar80 * fVar106 + fVar76 * fVar102) ^ uVar43);
        local_928._8_4_ =
             (float)((uint)(fVar63 * fVar94 + fVar81 * fVar108 + fVar77 * fVar103) ^ uVar46);
        local_928._12_4_ =
             (float)((uint)(fVar67 * fVar96 + fVar82 * fVar110 + fVar78 * fVar104) ^ uVar49);
        local_918 = (float)((uint)(fVar90 * fVar83 + fVar105 * fVar89 + fVar101 * fVar97) ^ uVar39);
        fStack_914 = (float)((uint)(fVar92 * fVar84 + fVar106 * fVar91 + fVar102 * fVar98) ^ uVar43)
        ;
        fStack_910 = (float)((uint)(fVar94 * fVar85 + fVar108 * fVar93 + fVar103 * fVar99) ^ uVar46)
        ;
        fStack_90c = (float)((uint)(fVar96 * fVar86 + fVar110 * fVar95 + fVar104 * fVar100) ^ uVar49
                            );
        local_8f8 = ABS(fVar38);
        fStack_8f4 = ABS(fVar87);
        fStack_8f0 = ABS(fVar88);
        fStack_8ec = ABS(fVar42);
        bVar23 = ((0.0 <= local_918 && 0.0 <= local_928._0_4_) && fVar38 != 0.0) &&
                 local_928._0_4_ + local_918 <= local_8f8;
        bVar24 = ((0.0 <= fStack_914 && 0.0 <= local_928._4_4_) && fVar87 != 0.0) &&
                 local_928._4_4_ + fStack_914 <= fStack_8f4;
        bVar25 = ((0.0 <= fStack_910 && 0.0 <= local_928._8_4_) && fVar88 != 0.0) &&
                 local_928._8_4_ + fStack_910 <= fStack_8f0;
        bVar26 = ((0.0 <= fStack_90c && 0.0 <= local_928._12_4_) && fVar42 != 0.0) &&
                 local_928._12_4_ + fStack_90c <= fStack_8ec;
        auVar22._4_4_ = -(uint)bVar24;
        auVar22._0_4_ = -(uint)bVar23;
        auVar22._8_4_ = -(uint)bVar25;
        auVar22._12_4_ = -(uint)bVar26;
        iVar27 = movmskps((int)lVar28,auVar22);
        if (iVar27 != 0) {
          local_908 = (float)(uVar39 ^ (uint)(fVar51 * local_898[0] +
                                             fVar56 * local_888[0] + fVar60 * local_878[0]));
          fStack_904 = (float)(uVar43 ^ (uint)(fVar64 * local_898[1] +
                                              fVar70 * local_888[1] + fVar44 * local_878[1]));
          fStack_900 = (float)(uVar46 ^ (uint)(fVar107 * local_898[2] +
                                              fVar72 * local_888[2] + fVar47 * local_878[2]));
          fStack_8fc = (float)(uVar49 ^ (uint)(fVar109 * local_898[3] +
                                              fVar74 * local_888[3] + fVar50 * local_878[3]));
          fVar38 = *(float *)(ray + k * 4 + 0x30);
          fVar42 = *(float *)(ray + k * 4 + 0x80);
          local_8d8._0_4_ =
               -(uint)((local_908 <= fVar42 * local_8f8 && fVar38 * local_8f8 < local_908) && bVar23
                      );
          local_8d8._4_4_ =
               -(uint)((fStack_904 <= fVar42 * fStack_8f4 && fVar38 * fStack_8f4 < fStack_904) &&
                      bVar24);
          local_8d8._8_4_ =
               -(uint)((fStack_900 <= fVar42 * fStack_8f0 && fVar38 * fStack_8f0 < fStack_900) &&
                      bVar25);
          local_8d8._12_4_ =
               -(uint)((fStack_8fc <= fVar42 * fStack_8ec && fVar38 * fStack_8ec < fStack_8fc) &&
                      bVar26);
          uVar39 = movmskps(iVar27,local_8d8);
          if (uVar39 != 0) {
            auVar21._4_4_ = fStack_8f4;
            auVar21._0_4_ = local_8f8;
            auVar21._8_4_ = fStack_8f0;
            auVar21._12_4_ = fStack_8ec;
            auVar40 = rcpps(local_8d8,auVar21);
            fVar38 = auVar40._0_4_;
            fVar45 = auVar40._4_4_;
            fVar48 = auVar40._8_4_;
            fVar51 = auVar40._12_4_;
            fVar38 = (1.0 - local_8f8 * fVar38) * fVar38 + fVar38;
            fVar45 = (1.0 - fStack_8f4 * fVar45) * fVar45 + fVar45;
            fVar48 = (1.0 - fStack_8f0 * fVar48) * fVar48 + fVar48;
            fVar51 = (1.0 - fStack_8ec * fVar51) * fVar51 + fVar51;
            local_8a8[0] = local_908 * fVar38;
            local_8a8[1] = fStack_904 * fVar45;
            local_8a8[2] = fStack_900 * fVar48;
            local_8a8[3] = fStack_8fc * fVar51;
            local_8c8._0_4_ = local_928._0_4_ * fVar38;
            local_8c8._4_4_ = local_928._4_4_ * fVar45;
            local_8c8._8_4_ = local_928._8_4_ * fVar48;
            local_8c8._12_4_ = local_928._12_4_ * fVar51;
            local_8b8._0_4_ = fVar38 * local_918;
            local_8b8._4_4_ = fVar45 * fStack_914;
            local_8b8._8_4_ = fVar48 * fStack_910;
            local_8b8._12_4_ = fVar51 * fStack_90c;
            local_a38 = (ulong)(uVar39 & 0xff);
            do {
              local_a40 = 0;
              if (local_a38 != 0) {
                for (; (local_a38 >> local_a40 & 1) == 0; local_a40 = local_a40 + 1) {
                }
              }
              local_808 = *(uint *)((long)&local_938 + local_a40 * 4);
              root.ptr = (size_t)local_808;
              local_a48 = (pSVar14->geometries).items[root.ptr].ptr;
              if ((local_a48->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                local_a38 = local_a38 ^ 1L << (local_a40 & 0x3f);
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (local_a48->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00253496:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar37;
                }
                local_838 = *(undefined4 *)(local_8c8 + local_a40 * 4);
                fVar38 = local_8a8[local_a40 - 4];
                *(float *)(ray + k * 4 + 0x80) = local_8a8[local_a40];
                args.context = context->user;
                local_818 = *(undefined4 *)((long)&local_948 + local_a40 * 4);
                local_828._4_4_ = fVar38;
                local_828._0_4_ = fVar38;
                local_828._8_4_ = fVar38;
                local_828._12_4_ = fVar38;
                local_868 = local_898[local_a40];
                local_858 = local_888[local_a40];
                local_848 = local_878[local_a40];
                fStack_864 = local_868;
                fStack_860 = local_868;
                fStack_85c = local_868;
                fStack_854 = local_858;
                fStack_850 = local_858;
                fStack_84c = local_858;
                fStack_844 = local_848;
                fStack_840 = local_848;
                fStack_83c = local_848;
                uStack_834 = local_838;
                uStack_830 = local_838;
                uStack_82c = local_838;
                uStack_814 = local_818;
                uStack_810 = local_818;
                uStack_80c = local_818;
                uStack_804 = local_808;
                uStack_800 = local_808;
                uStack_7fc = local_808;
                local_7f8 = (args.context)->instID[0];
                uStack_7f4 = local_7f8;
                uStack_7f0 = local_7f8;
                uStack_7ec = local_7f8;
                local_7e8 = (args.context)->instPrimID[0];
                uStack_7e4 = local_7e8;
                uStack_7e0 = local_7e8;
                uStack_7dc = local_7e8;
                local_a58 = *local_a28;
                args.valid = (int *)local_a58;
                args.geometryUserPtr = local_a48->userPtr;
                args.hit = (RTCHitN *)&local_868;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (local_a48->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*local_a48->occlusionFilterN)(&args);
                  root.ptr = extraout_RDX;
                }
                if (local_a58 == (undefined1  [16])0x0) {
                  auVar55._8_4_ = 0xffffffff;
                  auVar55._0_8_ = 0xffffffffffffffff;
                  auVar55._12_4_ = 0xffffffff;
                  auVar55 = auVar55 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var20 = context->args->filter;
                  if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_a48->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var20)(&args);
                    root.ptr = extraout_RDX_00;
                  }
                  auVar41._0_4_ = -(uint)(local_a58._0_4_ == 0);
                  auVar41._4_4_ = -(uint)(local_a58._4_4_ == 0);
                  auVar41._8_4_ = -(uint)(local_a58._8_4_ == 0);
                  auVar41._12_4_ = -(uint)(local_a58._12_4_ == 0);
                  auVar55 = auVar41 ^ _DAT_01f7ae20;
                  auVar40 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar41);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar40;
                }
                if ((_DAT_01f7bb20 & auVar55) != (undefined1  [16])0x0) goto LAB_00253496;
                *(float *)(ray + k * 4 + 0x80) = fVar42;
                local_a38 = local_a38 ^ 1L << (local_a40 & 0x3f);
              }
            } while (local_a38 != 0);
          }
        }
        local_a30 = local_a30 + 1;
      } while (local_a30 != uVar33 - 8);
    }
    bVar37 = local_a10 != stack;
    uVar33 = local_a20;
joined_r0x00252db1:
    if (!bVar37) {
      return bVar37;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }